

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TweakableParser.cpp
# Opt level: O0

Pair<Corrade::Utility::TweakableState,_long_long>
Corrade::Utility::TweakableParser<long_long>::parse(StringView value)

{
  StringView value_00;
  StringView value_01;
  longlong lVar1;
  char **ppcVar2;
  int *piVar3;
  char *pcVar4;
  Debug *pDVar5;
  undefined8 extraout_RAX;
  size_t sVar6;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 uVar7;
  size_t in_RDX;
  Pair<const_char_*,_int> PVar8;
  Pair<Corrade::Utility::TweakableState,_long_long> PVar9;
  StringView value_02;
  TweakableState local_169;
  longlong local_168;
  TweakableState local_159;
  BasicStringView<const_char> local_158;
  Flags local_141;
  Warning local_140;
  longlong local_118;
  TweakableState local_109 [9];
  char *pcStack_100;
  Flags local_f1;
  Warning local_f0;
  longlong local_c8;
  TweakableState local_b9 [9];
  char *pcStack_b0;
  Flags local_91;
  Warning local_90;
  longlong local_68;
  longlong result;
  char *end;
  int local_50;
  anon_unknown_14 *local_48;
  char *pcStack_40;
  undefined1 local_38 [8];
  Pair<const_char_*,_int> valueBase;
  StringView value_local;
  longlong local_10;
  
  value_02._data = (char *)value._sizePlusFlags;
  local_48 = (anon_unknown_14 *)value._data;
  value_02._sizePlusFlags = in_RDX;
  pcStack_40 = value_02._data;
  valueBase._8_8_ = local_48;
  value_local._data = value_02._data;
  PVar8 = anon_unknown_14::integerBase(local_48,value_02);
  end = PVar8._first;
  local_50 = PVar8._second;
  local_38 = (undefined1  [8])end;
  valueBase._first._0_4_ = local_50;
  ppcVar2 = Containers::Pair<const_char_*,_int>::first((Pair<const_char_*,_int> *)local_38);
  pcVar4 = *ppcVar2;
  piVar3 = Containers::Pair<const_char_*,_int>::second((Pair<const_char_*,_int> *)local_38);
  local_68 = strtoll(pcVar4,(char **)&result,*piVar3);
  lVar1 = result;
  pcVar4 = Containers::BasicStringView<const_char>::begin
                     ((BasicStringView<const_char> *)&valueBase._second);
  if ((char *)lVar1 == pcVar4) {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_91);
    Warning::Warning(&local_90,local_91);
    pDVar5 = Debug::operator<<(&local_90.super_Debug,"Utility::TweakableParser:");
    local_b9._1_8_ = valueBase._8_8_;
    pcStack_b0 = value_local._data;
    value_01._sizePlusFlags = (size_t)value_local._data;
    value_01._data = (char *)valueBase._8_8_;
    pDVar5 = Debug::operator<<(pDVar5,value_01);
    Debug::operator<<(pDVar5,"is not an integer literal");
    Warning::~Warning(&local_90);
    local_b9[0] = Recompile;
    local_c8 = 0;
    Containers::Pair<Corrade::Utility::TweakableState,_long_long>::Pair
              ((Pair<Corrade::Utility::TweakableState,_long_long> *)&value_local._sizePlusFlags,
               local_b9,&local_c8);
    uVar7 = extraout_RAX;
    goto LAB_001b6841;
  }
  sVar6 = Containers::BasicStringView<const_char>::size
                    ((BasicStringView<const_char> *)&valueBase._second);
  if (sVar6 < 2) {
LAB_001b660f:
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_f1);
    Warning::Warning(&local_f0,local_f1);
    pDVar5 = Debug::operator<<(&local_f0.super_Debug,"Utility::TweakableParser:");
    local_109._1_8_ = valueBase._8_8_;
    pcStack_100 = value_local._data;
    value_00._sizePlusFlags = (size_t)value_local._data;
    value_00._data = (char *)valueBase._8_8_;
    pDVar5 = Debug::operator<<(pDVar5,value_00);
    Debug::operator<<(pDVar5,"has an unexpected suffix, expected ll");
    Warning::~Warning(&local_f0);
    local_109[0] = Recompile;
    local_118 = 0;
    Containers::Pair<Corrade::Utility::TweakableState,_long_long>::Pair
              ((Pair<Corrade::Utility::TweakableState,_long_long> *)&value_local._sizePlusFlags,
               local_109,&local_118);
    uVar7 = extraout_RAX_00;
  }
  else {
    sVar6 = Containers::BasicStringView<const_char>::size
                      ((BasicStringView<const_char> *)&valueBase._second);
    pcVar4 = Containers::BasicStringView<const_char>::operator[]
                       ((BasicStringView<const_char> *)&valueBase._second,sVar6 - 1);
    if (*pcVar4 != 'l') {
      sVar6 = Containers::BasicStringView<const_char>::size
                        ((BasicStringView<const_char> *)&valueBase._second);
      pcVar4 = Containers::BasicStringView<const_char>::operator[]
                         ((BasicStringView<const_char> *)&valueBase._second,sVar6 - 1);
      if (*pcVar4 != 'L') {
        sVar6 = Containers::BasicStringView<const_char>::size
                          ((BasicStringView<const_char> *)&valueBase._second);
        pcVar4 = Containers::BasicStringView<const_char>::operator[]
                           ((BasicStringView<const_char> *)&valueBase._second,sVar6 - 2);
        if (*pcVar4 != 'l') {
          sVar6 = Containers::BasicStringView<const_char>::size
                            ((BasicStringView<const_char> *)&valueBase._second);
          pcVar4 = Containers::BasicStringView<const_char>::operator[]
                             ((BasicStringView<const_char> *)&valueBase._second,sVar6 - 2);
          if (*pcVar4 != 'L') goto LAB_001b660f;
        }
      }
    }
    lVar1 = result;
    pcVar4 = Containers::BasicStringView<const_char>::end
                       ((BasicStringView<const_char> *)&valueBase._second);
    if ((char *)lVar1 == pcVar4 + -2) {
      local_169 = Success;
      Containers::Pair<Corrade::Utility::TweakableState,_long_long>::Pair
                ((Pair<Corrade::Utility::TweakableState,_long_long> *)&value_local._sizePlusFlags,
                 &local_169,&local_68);
      uVar7 = extraout_RAX_02;
    }
    else {
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_141)
      ;
      Warning::Warning(&local_140,local_141);
      pDVar5 = Debug::operator<<(&local_140.super_Debug,
                                 "Utility::TweakableParser: unexpected characters");
      local_158 = Containers::BasicStringView<const_char>::suffix
                            ((BasicStringView<const_char> *)&valueBase._second,(char *)result);
      pDVar5 = Debug::operator<<(pDVar5,local_158);
      Debug::operator<<(pDVar5,"after an integer literal");
      Warning::~Warning(&local_140);
      local_159 = Recompile;
      local_168 = 0;
      Containers::Pair<Corrade::Utility::TweakableState,_long_long>::Pair
                ((Pair<Corrade::Utility::TweakableState,_long_long> *)&value_local._sizePlusFlags,
                 &local_159,&local_168);
      uVar7 = extraout_RAX_01;
    }
  }
LAB_001b6841:
  PVar9._1_7_ = (undefined7)((ulong)uVar7 >> 8);
  PVar9._first = (undefined1)value_local._sizePlusFlags;
  PVar9._second = local_10;
  return PVar9;
}

Assistant:

Containers::Pair<TweakableState, long long> TweakableParser<long long>::parse(Containers::StringView value) {
    const Containers::Pair<const char*, int> valueBase = integerBase(value);
    char* end;
    const long long result = std::strtoll(valueBase.first(), &end, valueBase.second());

    if(end == value.begin()) {
        Warning{} << "Utility::TweakableParser:" << value << "is not an integer literal";
        return {TweakableState::Recompile, {}};
    }

    if(value.size() < 2 ||
      (value[value.size() - 1] != 'l' && value[value.size() - 1] != 'L' &&
       value[value.size() - 2] != 'l' && value[value.size() - 2] != 'L'))
    {
        Warning{} << "Utility::TweakableParser:" << value << "has an unexpected suffix, expected ll";
        return {TweakableState::Recompile, {}};
    }

    if(end != value.end() - 2) {
        Warning{} << "Utility::TweakableParser: unexpected characters" << value.suffix(end) << "after an integer literal";
        return {TweakableState::Recompile, {}};
    }

    return {TweakableState::Success, result};
}